

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O3

XML_Error entityValueInitProcessor(XML_Parser parser,char *s,char *end,char **nextPtr)

{
  char *s_00;
  XML_Bool XVar1;
  int iVar2;
  XML_Error XVar3;
  char *next;
  char *local_38;
  
  parser->m_eventPtr = s;
  local_38 = s;
  iVar2 = (*parser->m_encoding->scanners[0])(parser->m_encoding,s,end,&local_38);
  parser->m_eventEndPtr = local_38;
  s_00 = s;
  do {
    if (iVar2 < 1) {
      if ((iVar2 == 0) || ((parser->m_parsingStatus).finalBuffer != '\0')) {
        if (iVar2 + 2U < 3) {
          XVar3 = XML_ERROR_INVALID_TOKEN - iVar2;
        }
        else {
          XVar3 = storeEntityValue(parser,parser->m_encoding,s,end,XML_ACCOUNT_DIRECT);
        }
      }
      else {
        *nextPtr = s;
        XVar3 = XML_ERROR_NONE;
      }
      return XVar3;
    }
    if (iVar2 == 0xe) {
      XVar1 = accountingDiffTolerated(parser,0xe,s,local_38,0x11e2,XML_ACCOUNT_DIRECT);
      if (XVar1 == '\0') {
        accountingReportStats(parser," ABORTING\n");
        return XML_ERROR_AMPLIFICATION_LIMIT_BREACH;
      }
      *nextPtr = local_38;
      s = local_38;
    }
    else {
      if (iVar2 == 0x1d) {
        *nextPtr = local_38;
        return XML_ERROR_SYNTAX;
      }
      if (iVar2 == 0xc) {
        XVar3 = processXmlDecl(parser,0,s_00,local_38);
        if (XVar3 != XML_ERROR_NONE) {
          return XVar3;
        }
        if ((parser->m_parsingStatus).parsing == XML_FINISHED) {
          return XML_ERROR_ABORTED;
        }
        *nextPtr = local_38;
        parser->m_processor = entityValueProcessor;
        XVar3 = entityValueProcessor(parser,local_38,end,nextPtr);
        return XVar3;
      }
    }
    s_00 = local_38;
    parser->m_eventPtr = local_38;
    iVar2 = (*parser->m_encoding->scanners[0])(parser->m_encoding,local_38,end,&local_38);
    parser->m_eventEndPtr = local_38;
  } while( true );
}

Assistant:

static enum XML_Error PTRCALL
entityValueInitProcessor(XML_Parser parser, const char *s, const char *end,
                         const char **nextPtr) {
  int tok;
  const char *start = s;
  const char *next = start;
  parser->m_eventPtr = start;

  for (;;) {
    tok = XmlPrologTok(parser->m_encoding, start, end, &next);
    /* Note: Except for XML_TOK_BOM below, these bytes are accounted later in:
             - storeEntityValue
             - processXmlDecl
    */
    parser->m_eventEndPtr = next;
    if (tok <= 0) {
      if (! parser->m_parsingStatus.finalBuffer && tok != XML_TOK_INVALID) {
        *nextPtr = s;
        return XML_ERROR_NONE;
      }
      switch (tok) {
      case XML_TOK_INVALID:
        return XML_ERROR_INVALID_TOKEN;
      case XML_TOK_PARTIAL:
        return XML_ERROR_UNCLOSED_TOKEN;
      case XML_TOK_PARTIAL_CHAR:
        return XML_ERROR_PARTIAL_CHAR;
      case XML_TOK_NONE: /* start == end */
      default:
        break;
      }
      /* found end of entity value - can store it now */
      return storeEntityValue(parser, parser->m_encoding, s, end,
                              XML_ACCOUNT_DIRECT);
    } else if (tok == XML_TOK_XML_DECL) {
      enum XML_Error result;
      result = processXmlDecl(parser, 0, start, next);
      if (result != XML_ERROR_NONE)
        return result;
      /* At this point, m_parsingStatus.parsing cannot be XML_SUSPENDED.  For
       * that to happen, a parameter entity parsing handler must have attempted
       * to suspend the parser, which fails and raises an error.  The parser can
       * be aborted, but can't be suspended.
       */
      if (parser->m_parsingStatus.parsing == XML_FINISHED)
        return XML_ERROR_ABORTED;
      *nextPtr = next;
      /* stop scanning for text declaration - we found one */
      parser->m_processor = entityValueProcessor;
      return entityValueProcessor(parser, next, end, nextPtr);
    }
    /* XmlPrologTok has now set the encoding based on the BOM it found, and we
       must move s and nextPtr forward to consume the BOM.

       If we didn't, and got XML_TOK_NONE from the next XmlPrologTok call, we
       would leave the BOM in the buffer and return. On the next call to this
       function, our XmlPrologTok call would return XML_TOK_INVALID, since it
       is not valid to have multiple BOMs.
    */
    else if (tok == XML_TOK_BOM) {
#  if XML_GE == 1
      if (! accountingDiffTolerated(parser, tok, s, next, __LINE__,
                                    XML_ACCOUNT_DIRECT)) {
        accountingOnAbort(parser);
        return XML_ERROR_AMPLIFICATION_LIMIT_BREACH;
      }
#  endif

      *nextPtr = next;
      s = next;
    }
    /* If we get this token, we have the start of what might be a
       normal tag, but not a declaration (i.e. it doesn't begin with
       "<!").  In a DTD context, that isn't legal.
    */
    else if (tok == XML_TOK_INSTANCE_START) {
      *nextPtr = next;
      return XML_ERROR_SYNTAX;
    }
    start = next;
    parser->m_eventPtr = start;
  }
}